

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_1a9f8::Help(void)

{
  std::operator<<((ostream *)&std::cout,
                  "usage: ram [options ...] <target> [<sequences>]\n\n  # default output is stdout\n  <target>/<sequences> \n    input file in FASTA/FASTQ format (can be compressed with gzip)\n\n  options:\n    -k, --kmer-length <int>\n      default: 15\n      length of minimizers\n    -w, --window-length <int>\n      default: 5\n      length of sliding window from which minimizers are sampled\n    -f, --frequency-threshold <float>\n      default: 0.001\n      threshold for ignoring most frequent minimizers\n    --bandwidth <int>\n      default: 500\n      size of bandwidth in which minimizer hits can be chained\n    --chain <int>\n      default: 4\n      minimal number of chained minimizer hits in overlap\n    --matches <int>\n      default: 100\n      minimal number of matching bases in overlap\n    --gap <int>\n      default: 10000\n      maximal gap between minimizer hits in a chain\n    --minhash\n      use only a portion of all minimizers\n    -t, --threads <int>\n      default: 1\n      number of threads\n    --version\n      prints the version number\n    -h, --help\n      prints the usage\n"
                 );
  return;
}

Assistant:

void Help() {
  std::cout <<
      "usage: ram [options ...] <target> [<sequences>]\n"
      "\n"
      "  # default output is stdout\n"
      "  <target>/<sequences> \n"
      "    input file in FASTA/FASTQ format (can be compressed with gzip)\n"
      "\n"
      "  options:\n"
      "    -k, --kmer-length <int>\n"
      "      default: 15\n"
      "      length of minimizers\n"
      "    -w, --window-length <int>\n"
      "      default: 5\n"
      "      length of sliding window from which minimizers are sampled\n"
      "    -f, --frequency-threshold <float>\n"
      "      default: 0.001\n"
      "      threshold for ignoring most frequent minimizers\n"
      "    --bandwidth <int>\n"
      "      default: 500\n"
      "      size of bandwidth in which minimizer hits can be chained\n"
      "    --chain <int>\n"
      "      default: 4\n"
      "      minimal number of chained minimizer hits in overlap\n"
      "    --matches <int>\n"
      "      default: 100\n"
      "      minimal number of matching bases in overlap\n"
      "    --gap <int>\n"
      "      default: 10000\n"
      "      maximal gap between minimizer hits in a chain\n"
      "    --minhash\n"
      "      use only a portion of all minimizers\n"
      "    -t, --threads <int>\n"
      "      default: 1\n"
      "      number of threads\n"
      "    --version\n"
      "      prints the version number\n"
      "    -h, --help\n"
      "      prints the usage\n";
}